

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O2

bool WriteAppleDODisk(FILE *f_,Disk *disk,Format *fmt)

{
  int iVar1;
  int missing;
  FILE *f__local;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  Range local_30;
  
  missing = 0;
  f__local = f_;
  local_30 = Format::range(fmt);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x20);
  *(Disk **)local_58._M_unused._0_8_ = disk;
  *(Format **)((long)local_58._M_unused._0_8_ + 8) = fmt;
  *(int **)((long)local_58._M_unused._0_8_ + 0x10) = &missing;
  *(FILE ***)((long)local_58._M_unused._0_8_ + 0x18) = &f__local;
  pcStack_40 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/DiskUtil.cpp:871:22)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/DiskUtil.cpp:871:22)>
             ::_M_manager;
  Range::each(&local_30,(function<void_(const_CylHead_&)> *)&local_58,fmt->cyls_first);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  if ((missing != 0) && (opt.minimal == 0)) {
    iVar1 = Format::sector_size(fmt);
    local_58._0_4_ = iVar1;
    Message<int&,int_const&,int_const&,int_const&,int>
              (msgWarning,"source missing %u sectors from %u/%u/%u/%u regular format",&missing,
               &fmt->cyls,&fmt->heads,&fmt->sectors,(int *)local_58._M_pod_data);
  }
  return true;
}

Assistant:

bool WriteAppleDODisk(FILE* f_, Disk& disk, const Format& fmt)
{
    auto missing = 0;
    static const int map[16] = { 0, 13, 11, 9, 7, 5, 3, 1, 14, 12, 10, 8, 6, 4, 2, 15 };

    fmt.range().each([&](const CylHead& cylhead) {
        const auto& track = disk.read_track(cylhead);
        Header header(cylhead, 0, fmt.size);

        for (int sector = fmt.base; sector < fmt.base + fmt.sectors; ++sector)
        {
            Data buf(fmt.sector_size(), fmt.fill);
            header.sector = map[sector];

            auto it = track.find(header);
            if (it != track.end() && (*it).has_data())
            {
                const auto& data = (*it).data_copy();
                std::copy(data.begin(), data.begin() + std::min(data.size(), buf.size()), buf.begin());
            }
            else
            {
                missing++;
            }

            if (!fwrite(buf.data(), buf.size(), 1, f_))
                throw util::exception("write error, disk full?");
        }
        }, fmt.cyls_first);

    if (missing && !opt.minimal)
        Message(msgWarning, "source missing %u sectors from %u/%u/%u/%u regular format", missing, fmt.cyls, fmt.heads, fmt.sectors, fmt.sector_size());

    return true;
}